

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

TransposeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_transpose(NeuralNetworkLayer *this)

{
  bool bVar1;
  TransposeLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_transpose(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_transpose(this);
    this_00 = (TransposeLayerParams *)operator_new(0x28);
    TransposeLayerParams::TransposeLayerParams(this_00);
    (this->layer_).transpose_ = this_00;
  }
  return (TransposeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::TransposeLayerParams* NeuralNetworkLayer::mutable_transpose() {
  if (!has_transpose()) {
    clear_layer();
    set_has_transpose();
    layer_.transpose_ = new ::CoreML::Specification::TransposeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.transpose)
  return layer_.transpose_;
}